

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void llvm::APInt::udivrem(APInt *LHS,APInt *RHS,APInt *Quotient,APInt *Remainder)

{
  uint numBits;
  ulong uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  APInt *this;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  APInt *local_40;
  ulong local_38;
  
  numBits = LHS->BitWidth;
  uVar8 = RHS->BitWidth;
  if (numBits != uVar8) {
    __assert_fail("LHS.BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x6b5,
                  "static void llvm::APInt::udivrem(const APInt &, const APInt &, APInt &, APInt &)"
                 );
  }
  local_40 = Quotient;
  if (numBits < 0x41) {
    uVar6 = (RHS->U).VAL;
    if (uVar6 == 0) {
      __assert_fail("RHS.U.VAL != 0 && \"Divide by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x6ba,
                    "static void llvm::APInt::udivrem(const APInt &, const APInt &, APInt &, APInt &)"
                   );
    }
    uVar1 = (LHS->U).VAL;
    APInt((APInt *)&local_50,numBits,uVar1 / uVar6,false);
    operator=(local_40,(APInt *)&local_50);
    if ((0x40 < local_48) && ((void *)local_50.VAL != (void *)0x0)) {
      operator_delete__(local_50.pVal);
    }
    APInt((APInt *)&local_50,numBits,uVar1 % uVar6,false);
    operator=(Remainder,(APInt *)&local_50);
    goto joined_r0x0017bd58;
  }
  uVar4 = countLeadingZerosSlowCase(LHS);
  if (uVar8 < 0x41) {
    uVar6 = (RHS->U).VAL;
    if (uVar6 == 0) {
      uVar7 = 0x40;
    }
    else {
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar7 = (uint)lVar2 ^ 0x3f;
    }
    uVar7 = (uVar8 - 0x40) + uVar7;
  }
  else {
    uVar7 = countLeadingZerosSlowCase(RHS);
  }
  if (uVar8 == uVar7) {
    __assert_fail("rhsWords && \"Performing divrem operation by zero ???\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x6c6,
                  "static void llvm::APInt::udivrem(const APInt &, const APInt &, APInt &, APInt &)"
                 );
  }
  if (numBits == uVar4) {
    APInt((APInt *)&local_50,numBits,0,false);
    this = local_40;
LAB_0017bc31:
    operator=(this,(APInt *)&local_50);
    if ((0x40 < local_48) && ((void *)local_50.VAL != (void *)0x0)) {
      operator_delete__(local_50.pVal);
    }
    APInt((APInt *)&local_50,numBits,0,false);
    this = Remainder;
  }
  else {
    uVar6 = (ulong)(numBits - uVar4) + 0x3f >> 6;
    if (uVar8 - uVar7 == 1) {
      local_38 = uVar6;
      operator=(local_40,LHS);
      APInt((APInt *)&local_50,numBits,0,false);
      operator=(Remainder,(APInt *)&local_50);
      uVar6 = local_38;
      if ((0x40 < local_48) && ((void *)local_50.VAL != (void *)0x0)) {
        operator_delete__(local_50.pVal);
        uVar6 = local_38;
      }
    }
    this = local_40;
    uVar4 = (uint)uVar6;
    uVar8 = (uint)((ulong)(uVar8 - uVar7) + 0x3f >> 6);
    if ((uVar8 <= uVar4) && (iVar5 = compare(LHS,RHS), -1 < iVar5)) {
      bVar3 = operator==(LHS,RHS);
      if (!bVar3) {
        reallocate(this,numBits);
        reallocate(Remainder,numBits);
        if (uVar4 == 1) {
          uVar6 = *(LHS->U).pVal;
          uVar1 = *(RHS->U).pVal;
          operator=(this,uVar6 / uVar1);
          operator=(Remainder,uVar6 % uVar1);
          return;
        }
        divide((LHS->U).pVal,uVar4,(RHS->U).pVal,uVar8,(this->U).pVal,(Remainder->U).pVal);
        iVar5 = (int)((ulong)numBits + 0x3f >> 6);
        memset((void *)((ulong)(uVar4 * 8) + (long)(this->U).pVal),0,(ulong)((iVar5 - uVar4) * 8));
        memset((void *)((ulong)(uVar8 * 8) + (long)(Remainder->U).pVal),0,
               (ulong)((iVar5 - uVar8) * 8));
        return;
      }
      APInt((APInt *)&local_50,numBits,1,false);
      goto LAB_0017bc31;
    }
    operator=(Remainder,LHS);
    APInt((APInt *)&local_50,numBits,0,false);
  }
  operator=(this,(APInt *)&local_50);
joined_r0x0017bd58:
  if ((0x40 < local_48) && ((void *)local_50.VAL != (void *)0x0)) {
    operator_delete__(local_50.pVal);
  }
  return;
}

Assistant:

void APInt::udivrem(const APInt &LHS, const APInt &RHS,
                    APInt &Quotient, APInt &Remainder) {
  assert(LHS.BitWidth == RHS.BitWidth && "Bit widths must be the same");
  unsigned BitWidth = LHS.BitWidth;

  // First, deal with the easy case
  if (LHS.isSingleWord()) {
    assert(RHS.U.VAL != 0 && "Divide by zero?");
    uint64_t QuotVal = LHS.U.VAL / RHS.U.VAL;
    uint64_t RemVal = LHS.U.VAL % RHS.U.VAL;
    Quotient = APInt(BitWidth, QuotVal);
    Remainder = APInt(BitWidth, RemVal);
    return;
  }

  // Get some size facts about the dividend and divisor
  unsigned lhsWords = getNumWords(LHS.getActiveBits());
  unsigned rhsBits  = RHS.getActiveBits();
  unsigned rhsWords = getNumWords(rhsBits);
  assert(rhsWords && "Performing divrem operation by zero ???");

  // Check the degenerate cases
  if (lhsWords == 0) {
    Quotient = APInt(BitWidth, 0);    // 0 / Y ===> 0
    Remainder = APInt(BitWidth, 0);   // 0 % Y ===> 0
    return;
  }

  if (rhsBits == 1) {
    Quotient = LHS;                   // X / 1 ===> X
    Remainder = APInt(BitWidth, 0);   // X % 1 ===> 0
  }

  if (lhsWords < rhsWords || LHS.ult(RHS)) {
    Remainder = LHS;                  // X % Y ===> X, iff X < Y
    Quotient = APInt(BitWidth, 0);    // X / Y ===> 0, iff X < Y
    return;
  }

  if (LHS == RHS) {
    Quotient  = APInt(BitWidth, 1);   // X / X ===> 1
    Remainder = APInt(BitWidth, 0);   // X % X ===> 0;
    return;
  }

  // Make sure there is enough space to hold the results.
  // NOTE: This assumes that reallocate won't affect any bits if it doesn't
  // change the size. This is necessary if Quotient or Remainder is aliased
  // with LHS or RHS.
  Quotient.reallocate(BitWidth);
  Remainder.reallocate(BitWidth);

  if (lhsWords == 1) { // rhsWords is 1 if lhsWords is 1.
    // There is only one word to consider so use the native versions.
    uint64_t lhsValue = LHS.U.pVal[0];
    uint64_t rhsValue = RHS.U.pVal[0];
    Quotient = lhsValue / rhsValue;
    Remainder = lhsValue % rhsValue;
    return;
  }

  // Okay, lets do it the long way
  divide(LHS.U.pVal, lhsWords, RHS.U.pVal, rhsWords, Quotient.U.pVal,
         Remainder.U.pVal);
  // Clear the rest of the Quotient and Remainder.
  std::memset(Quotient.U.pVal + lhsWords, 0,
              (getNumWords(BitWidth) - lhsWords) * APINT_WORD_SIZE);
  std::memset(Remainder.U.pVal + rhsWords, 0,
              (getNumWords(BitWidth) - rhsWords) * APINT_WORD_SIZE);
}